

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_markdown_generator.cc
# Opt level: O0

void __thiscall
t_markdown_generator::generate_service(t_markdown_generator *this,t_service *tservice)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  t_service *ptVar4;
  vector<t_function_*,_std::allocator<t_function_*>_> *__x;
  reference pptVar5;
  string *psVar6;
  t_type *ptVar7;
  t_struct *ptVar8;
  members_type *pmVar9;
  t_const_value *ptVar10;
  reference pptVar11;
  __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_d0;
  __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_c8;
  __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_c0;
  iterator ex_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> excepts;
  __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_98;
  __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_90;
  iterator arg_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> args;
  bool first;
  string local_60 [8];
  string fn_name;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_38;
  iterator fn_iter;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  t_service *tservice_local;
  t_markdown_generator *this_local;
  
  poVar3 = std::operator<<((ostream *)&this->f_out_,"### Service: ");
  poVar3 = std::operator<<(poVar3,(string *)&(this->super_t_generator).service_name_);
  std::operator<<(poVar3,'\n');
  ptVar4 = t_service::get_extends(tservice);
  if (ptVar4 != (t_service *)0x0) {
    std::operator<<((ostream *)&this->f_out_,"**extends ** _");
    ptVar4 = t_service::get_extends(tservice);
    print_type(this,&ptVar4->super_t_type);
    poVar3 = std::operator<<((ostream *)&this->f_out_,"_");
    std::operator<<(poVar3,'\n');
  }
  print_doc(this,(t_doc *)tservice);
  std::operator<<((ostream *)&this->f_out_,'\n');
  __x = t_service::get_functions(tservice);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&fn_iter,__x);
  local_38._M_current =
       (t_function **)
       std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                 ((vector<t_function_*,_std::allocator<t_function_*>_> *)&fn_iter);
  while( true ) {
    fn_name.field_2._8_8_ =
         std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                   ((vector<t_function_*,_std::allocator<t_function_*>_> *)&fn_iter);
    bVar1 = __gnu_cxx::operator!=
                      (&local_38,
                       (__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                        *)((long)&fn_name.field_2 + 8));
    if (!bVar1) break;
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_38);
    psVar6 = t_function::get_name_abi_cxx11_(*pptVar5);
    std::__cxx11::string::string(local_60,(string *)psVar6);
    poVar3 = std::operator<<((ostream *)&this->f_out_,"#### Function: ");
    poVar3 = std::operator<<(poVar3,(string *)&(this->super_t_generator).service_name_);
    poVar3 = std::operator<<(poVar3,".");
    poVar3 = std::operator<<(poVar3,local_60);
    std::operator<<(poVar3,'\n');
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_38);
    print_doc(this,&(*pptVar5)->super_t_doc);
    poVar3 = std::operator<<((ostream *)&this->f_out_,'\n');
    std::operator<<(poVar3,'\n');
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_38);
    ptVar7 = t_function::get_returntype(*pptVar5);
    print_type(this,ptVar7);
    bVar1 = true;
    poVar3 = std::operator<<((ostream *)&this->f_out_,'\n');
    poVar3 = std::operator<<(poVar3," _");
    poVar3 = std::operator<<(poVar3,local_60);
    std::operator<<(poVar3,"_(");
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_38);
    ptVar8 = t_function::get_arglist(*pptVar5);
    pmVar9 = t_struct::get_members(ptVar8);
    std::vector<t_field_*,_std::allocator<t_field_*>_>::vector
              ((vector<t_field_*,_std::allocator<t_field_*>_> *)&arg_iter,pmVar9);
    local_90._M_current =
         (t_field **)
         std::vector<t_field_*,_std::allocator<t_field_*>_>::begin
                   ((vector<t_field_*,_std::allocator<t_field_*>_> *)&arg_iter);
    while( true ) {
      local_98._M_current =
           (t_field **)
           std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                     ((vector<t_field_*,_std::allocator<t_field_*>_> *)&arg_iter);
      bVar2 = __gnu_cxx::operator!=(&local_90,&local_98);
      if (!bVar2) break;
      if (!bVar1) {
        poVar3 = std::operator<<((ostream *)&this->f_out_,",");
        std::operator<<(poVar3,'\n');
      }
      bVar1 = false;
      pptVar11 = __gnu_cxx::
                 __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                 ::operator*(&local_90);
      ptVar7 = t_field::get_type(*pptVar11);
      print_type(this,ptVar7);
      poVar3 = std::operator<<((ostream *)&this->f_out_," ");
      pptVar11 = __gnu_cxx::
                 __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                 ::operator*(&local_90);
      psVar6 = t_field::get_name_abi_cxx11_(*pptVar11);
      std::operator<<(poVar3,(string *)psVar6);
      pptVar11 = __gnu_cxx::
                 __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                 ::operator*(&local_90);
      ptVar10 = t_field::get_value(*pptVar11);
      if (ptVar10 != (t_const_value *)0x0) {
        std::operator<<((ostream *)&this->f_out_," = ");
        pptVar11 = __gnu_cxx::
                   __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*(&local_90);
        ptVar7 = t_field::get_type(*pptVar11);
        pptVar11 = __gnu_cxx::
                   __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*(&local_90);
        ptVar10 = t_field::get_value(*pptVar11);
        print_const_value(this,ptVar7,ptVar10);
      }
      __gnu_cxx::__normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
      ::operator++(&local_90,0);
    }
    poVar3 = std::operator<<((ostream *)&this->f_out_,")");
    std::operator<<(poVar3,'\n');
    bVar1 = true;
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_38);
    ptVar8 = t_function::get_xceptions(*pptVar5);
    pmVar9 = t_struct::get_members(ptVar8);
    std::vector<t_field_*,_std::allocator<t_field_*>_>::vector
              ((vector<t_field_*,_std::allocator<t_field_*>_> *)&ex_iter,pmVar9);
    local_c0._M_current =
         (t_field **)
         std::vector<t_field_*,_std::allocator<t_field_*>_>::begin
                   ((vector<t_field_*,_std::allocator<t_field_*>_> *)&ex_iter);
    local_c8._M_current =
         (t_field **)
         std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                   ((vector<t_field_*,_std::allocator<t_field_*>_> *)&ex_iter);
    bVar2 = __gnu_cxx::operator!=(&local_c0,&local_c8);
    if (bVar2) {
      std::operator<<((ostream *)&this->f_out_,"> throws ");
      while( true ) {
        local_d0._M_current =
             (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                       ((vector<t_field_*,_std::allocator<t_field_*>_> *)&ex_iter);
        bVar2 = __gnu_cxx::operator!=(&local_c0,&local_d0);
        if (!bVar2) break;
        if (!bVar1) {
          std::operator<<((ostream *)&this->f_out_,", ");
        }
        bVar1 = false;
        pptVar11 = __gnu_cxx::
                   __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*(&local_c0);
        ptVar7 = t_field::get_type(*pptVar11);
        print_type(this,ptVar7);
        __gnu_cxx::
        __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
        operator++(&local_c0,0);
      }
      std::operator<<((ostream *)&this->f_out_,'\n');
    }
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_38);
    print_fn_args_doc(this,*pptVar5);
    std::operator<<((ostream *)&this->f_out_,'\n');
    std::vector<t_field_*,_std::allocator<t_field_*>_>::~vector
              ((vector<t_field_*,_std::allocator<t_field_*>_> *)&ex_iter);
    std::vector<t_field_*,_std::allocator<t_field_*>_>::~vector
              ((vector<t_field_*,_std::allocator<t_field_*>_> *)&arg_iter);
    std::__cxx11::string::~string(local_60);
    __gnu_cxx::
    __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
    operator++(&local_38,0);
  }
  std::vector<t_function_*,_std::allocator<t_function_*>_>::~vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&fn_iter);
  return;
}

Assistant:

void t_markdown_generator::generate_service(t_service* tservice) {
  f_out_ << "### Service: " << service_name_ << endl;

  if (tservice->get_extends()) {
    f_out_ << "**extends ** _";
    print_type(tservice->get_extends());
    f_out_ << "_" << endl;
  }

  print_doc(tservice);
  f_out_ << endl;

  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator fn_iter = functions.begin();
  for (; fn_iter != functions.end(); fn_iter++) {
    string fn_name = (*fn_iter)->get_name();
    f_out_ << "#### Function: " << service_name_ << "." << fn_name << endl;
    print_doc(*fn_iter);
    f_out_ << endl << endl;
    print_type((*fn_iter)->get_returntype());
    bool first = true;
    f_out_ << endl << " _" << fn_name << "_(";
    vector<t_field*> args = (*fn_iter)->get_arglist()->get_members();
    vector<t_field*>::iterator arg_iter = args.begin();
    for (; arg_iter != args.end(); arg_iter++) {
      if (!first) {
        f_out_ << "," << endl;
      }
      first = false;
      print_type((*arg_iter)->get_type());
      f_out_ << " " << (*arg_iter)->get_name();
      if ((*arg_iter)->get_value() != nullptr) {
        f_out_ << " = ";
        print_const_value((*arg_iter)->get_type(), (*arg_iter)->get_value());
      }
    }
    f_out_ << ")" << endl;
    first = true;
    vector<t_field*> excepts = (*fn_iter)->get_xceptions()->get_members();
    vector<t_field*>::iterator ex_iter = excepts.begin();
    if (ex_iter != excepts.end()) {
      f_out_ << "> throws ";
      for (; ex_iter != excepts.end(); ex_iter++) {
        if (!first) {
          f_out_ << ", ";
        }
        first = false;
        print_type((*ex_iter)->get_type());
      }
      f_out_ << endl;
    }
    print_fn_args_doc(*fn_iter);
    f_out_ << endl;
  }
}